

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O1

bitwidth_t __thiscall slang::SVInt::getActiveBits(SVInt *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  bitwidth_t bVar5;
  
  uVar1 = (this->super_SVIntStorage).bitWidth;
  if ((uVar1 < 0x41) && (((this->super_SVIntStorage).unknownFlag & 1U) == 0)) {
    uVar2 = (this->super_SVIntStorage).field_0.val;
    if (uVar2 == 0) {
      uVar4 = 0x40;
    }
    else {
      lVar3 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar4 = (uint)lVar3 ^ 0x3f;
    }
    bVar5 = (uVar4 + uVar1) - 0x40;
  }
  else {
    bVar5 = countLeadingZerosSlowCase(this);
  }
  return uVar1 - bVar5;
}

Assistant:

bitwidth_t getActiveBits() const { return bitWidth - countLeadingZeros(); }